

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int encode(char *outfile,long *nlength,int *a,int nx,int ny,int scale)

{
  int iVar1;
  int iVar2;
  uchar *nbitplanes_00;
  int in_ECX;
  undefined4 *in_RDX;
  long *in_RSI;
  int in_R8D;
  int stat;
  uchar *signbits;
  uchar nbitplanes [3];
  int bits_to_go;
  int nsign;
  int vmax [3];
  int q;
  int k;
  int j;
  int i;
  int ny2;
  int nx2;
  int nel;
  long in_stack_ffffffffffffff88;
  int n;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int nx_00;
  int iVar3;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_4;
  
  noutchar = 0;
  iVar1 = in_ECX * in_R8D;
  qwrite(in_stack_ffffffffffffff98,
         (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
         (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  writeint((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
           (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  writeint((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
           (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  writeint((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
           (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  writelonglong((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                (LONGLONG)in_stack_ffffffffffffff98);
  *in_RDX = 0;
  nbitplanes_00 = (uchar *)calloc(1,(long)((iVar1 + 7) / 8));
  if (nbitplanes_00 == (uchar *)0x0) {
    ffpmsg((char *)0x26ae6b);
    local_4 = 0x19d;
  }
  else {
    iVar3 = 0;
    nx_00 = 8;
    for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
      if ((int)in_RDX[local_3c] < 1) {
        if ((int)in_RDX[local_3c] < 0) {
          nbitplanes_00[iVar3] = nbitplanes_00[iVar3] << 1;
          nbitplanes_00[iVar3] = nbitplanes_00[iVar3] | 1;
          nx_00 = nx_00 + -1;
          in_RDX[local_3c] = -in_RDX[local_3c];
        }
      }
      else {
        nbitplanes_00[iVar3] = nbitplanes_00[iVar3] << 1;
        nx_00 = nx_00 + -1;
      }
      if (nx_00 == 0) {
        nx_00 = 8;
        iVar3 = iVar3 + 1;
      }
    }
    if (nx_00 != 8) {
      in_stack_ffffffffffffff88 = (long)iVar3;
      nbitplanes_00[in_stack_ffffffffffffff88] =
           nbitplanes_00[in_stack_ffffffffffffff88] << ((byte)nx_00 & 0x1f);
      iVar3 = iVar3 + 1;
    }
    n = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
      *(undefined4 *)(&stack0xffffffffffffffac + (long)local_48 * 4) = 0;
    }
    local_40 = 0;
    local_44 = 0;
    for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
      iVar2 = (uint)((in_R8D + 1) / 2 <= local_40) + (uint)((in_ECX + 1) / 2 <= local_44);
      if (*(int *)(&stack0xffffffffffffffac + (long)iVar2 * 4) < (int)in_RDX[local_3c]) {
        *(undefined4 *)(&stack0xffffffffffffffac + (long)iVar2 * 4) = in_RDX[local_3c];
      }
      local_40 = local_40 + 1;
      if (in_R8D <= local_40) {
        local_40 = 0;
        local_44 = local_44 + 1;
      }
    }
    for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
      (&stack0xffffffffffffffa1)[local_48] = 0;
      while (0 < *(int *)(&stack0xffffffffffffffac + (long)local_48 * 4)) {
        *(int *)(&stack0xffffffffffffffac + (long)local_48 * 4) =
             *(int *)(&stack0xffffffffffffffac + (long)local_48 * 4) >> 1;
        (&stack0xffffffffffffffa1)[local_48] = (&stack0xffffffffffffffa1)[local_48] + '\x01';
      }
    }
    iVar1 = qwrite((char *)nbitplanes_00,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),n);
    if (iVar1 == 0) {
      *in_RSI = noutchar;
      ffpmsg((char *)0x26b11e);
      local_4 = 0x19d;
    }
    else {
      local_4 = doencode(in_stack_ffffffffffffffb0,(int *)CONCAT44(in_stack_ffffffffffffffac,iVar3),
                         nx_00,in_stack_ffffffffffffffa0,nbitplanes_00);
      if ((iVar3 < 1) ||
         (iVar1 = qwrite((char *)nbitplanes_00,(char *)CONCAT44(local_4,in_stack_ffffffffffffff90),n
                        ), iVar1 != 0)) {
        free(nbitplanes_00);
        *in_RSI = noutchar;
        if (noutmax <= noutchar) {
          ffpmsg((char *)0x26b1d3);
          local_4 = 0x19d;
        }
      }
      else {
        free(nbitplanes_00);
        *in_RSI = noutchar;
        ffpmsg((char *)0x26b192);
        local_4 = 0x19d;
      }
    }
  }
  return local_4;
}

Assistant:

static int encode(char *outfile, long *nlength, int a[], int nx, int ny, int scale)
{

/* FILE *outfile;  - change outfile to a char array */  
/*
  long * nlength    returned length (in bytes) of the encoded array)
  int a[];								 input H-transform array (nx,ny)
  int nx,ny;								 size of H-transform array	
  int scale;								 scale factor for digitization
*/
int nel, nx2, ny2, i, j, k, q, vmax[3], nsign, bits_to_go;
unsigned char nbitplanes[3];
unsigned char *signbits;
int stat;

        noutchar = 0;  /* initialize the number of compressed bytes that have been written */
	nel = nx*ny;
	/*
	 * write magic value
	 */
	qwrite(outfile, code_magic, sizeof(code_magic));
	writeint(outfile, nx);			/* size of image */
	writeint(outfile, ny);
	writeint(outfile, scale);		/* scale factor for digitization */
	/*
	 * write first value of A (sum of all pixels -- the only value
	 * which does not compress well)
	 */
	writelonglong(outfile, (LONGLONG) a[0]);

	a[0] = 0;
	/*
	 * allocate array for sign bits and save values, 8 per byte
              (initialize to all zeros)
	 */
	signbits = (unsigned char *) calloc(1, (nel+7)/8);
	if (signbits == (unsigned char *) NULL) {
		ffpmsg("encode: insufficient memory");
		return(DATA_COMPRESSION_ERR);
	}
	nsign = 0;
	bits_to_go = 8;
/*	signbits[0] = 0; */
	for (i=0; i<nel; i++) {
		if (a[i] > 0) {
			/*
			 * positive element, put zero at end of buffer
			 */
			signbits[nsign] <<= 1;
			bits_to_go -= 1;
		} else if (a[i] < 0) {
			/*
			 * negative element, shift in a one
			 */
			signbits[nsign] <<= 1;
			signbits[nsign] |= 1;
			bits_to_go -= 1;
			/*
			 * replace a by absolute value
			 */
			a[i] = -a[i];
		}
		if (bits_to_go == 0) {
			/*
			 * filled up this byte, go to the next one
			 */
			bits_to_go = 8;
			nsign += 1;
/*			signbits[nsign] = 0; */
		}
	}
	if (bits_to_go != 8) {
		/*
		 * some bits in last element
		 * move bits in last byte to bottom and increment nsign
		 */
		signbits[nsign] <<= bits_to_go;
		nsign += 1;
	}
	/*
	 * calculate number of bit planes for 3 quadrants
	 *
	 * quadrant 0=bottom left, 1=bottom right or top left, 2=top right, 
	 */
	for (q=0; q<3; q++) {
		vmax[q] = 0;
	}
	/*
	 * get maximum absolute value in each quadrant
	 */
	nx2 = (nx+1)/2;
	ny2 = (ny+1)/2;
	j=0;	/* column counter	*/
	k=0;	/* row counter		*/
	for (i=0; i<nel; i++) {
		q = (j>=ny2) + (k>=nx2);
		if (vmax[q] < a[i]) vmax[q] = a[i];
		if (++j >= ny) {
			j = 0;
			k += 1;
		}
	}
	/*
	 * now calculate number of bits for each quadrant
	 */

        /* this is a more efficient way to do this, */
 
 
        for (q = 0; q < 3; q++) {
            for (nbitplanes[q] = 0; vmax[q]>0; vmax[q] = vmax[q]>>1, nbitplanes[q]++) ; 
        }


/*
	for (q = 0; q < 3; q++) {
		nbitplanes[q] = (int) (log((float) (vmax[q]+1))/log(2.0)+0.5);
		if ( (vmax[q]+1) > (1<<nbitplanes[q]) ) {
			nbitplanes[q] += 1;
		}
	}
*/

	/*
	 * write nbitplanes
	 */
	if (0 == qwrite(outfile, (char *) nbitplanes, sizeof(nbitplanes))) {
	        *nlength = noutchar;
		ffpmsg("encode: output buffer too small");
		return(DATA_COMPRESSION_ERR);
        }
	 
	/*
	 * write coded array
	 */
	stat = doencode(outfile, a, nx, ny, nbitplanes);
	/*
	 * write sign bits
	 */

	if (nsign > 0) {

	   if ( 0 == qwrite(outfile, (char *) signbits, nsign)) {
	        free(signbits);
	        *nlength = noutchar;
		ffpmsg("encode: output buffer too small");
		return(DATA_COMPRESSION_ERR);
          }
	} 
	
	free(signbits);
	*nlength = noutchar;

        if (noutchar >= noutmax) {
		ffpmsg("encode: output buffer too small");
		return(DATA_COMPRESSION_ERR);
        }  
	
	return(stat); 
}